

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

void __thiscall leveldb::Status::Status(Status *this,Code code,Slice *msg,Slice *msg2)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  int local_50;
  char *result;
  uint32_t size;
  uint32_t len2;
  uint32_t len1;
  Slice *msg2_local;
  Slice *msg_local;
  Code code_local;
  Status *this_local;
  
  if (code != kOk) {
    sVar3 = Slice::size(msg);
    iVar1 = (int)sVar3;
    sVar4 = Slice::size(msg2);
    iVar2 = (int)sVar4;
    if (iVar2 == 0) {
      local_50 = 0;
    }
    else {
      local_50 = iVar2 + 2;
    }
    piVar5 = (int *)operator_new__((ulong)(iVar1 + local_50 + 5));
    *piVar5 = iVar1 + local_50;
    *(char *)(piVar5 + 1) = (char)code;
    pcVar6 = Slice::data(msg);
    memcpy((void *)((long)piVar5 + 5),pcVar6,sVar3 & 0xffffffff);
    if (iVar2 != 0) {
      *(undefined1 *)((long)piVar5 + (ulong)(iVar1 + 5)) = 0x3a;
      *(undefined1 *)((long)piVar5 + (ulong)(iVar1 + 6)) = 0x20;
      pcVar6 = Slice::data(msg2);
      memcpy((void *)((long)piVar5 + (sVar3 & 0xffffffff) + 7),pcVar6,sVar4 & 0xffffffff);
    }
    this->state_ = (char *)piVar5;
    return;
  }
  __assert_fail("code != kOk",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/status.cc"
                ,0x16,"leveldb::Status::Status(Code, const Slice &, const Slice &)");
}

Assistant:

Status::Status(Code code, const Slice& msg, const Slice& msg2) {
  assert(code != kOk);
  const uint32_t len1 = static_cast<uint32_t>(msg.size());
  const uint32_t len2 = static_cast<uint32_t>(msg2.size());
  const uint32_t size = len1 + (len2 ? (2 + len2) : 0);
  char* result = new char[size + 5];
  std::memcpy(result, &size, sizeof(size));
  result[4] = static_cast<char>(code);
  std::memcpy(result + 5, msg.data(), len1);
  if (len2) {
    result[5 + len1] = ':';
    result[6 + len1] = ' ';
    std::memcpy(result + 7 + len1, msg2.data(), len2);
  }
  state_ = result;
}